

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O1

void __thiscall r_exec::CSTController::reduce(CSTController *this,View *input)

{
  mutex *__mutex;
  list<core::P<r_exec::Overlay>_> *this_00;
  atomic_int_fast64_t *paVar1;
  _Object *p_Var2;
  _func_int **pp_Var3;
  pointer pcVar4;
  bool bVar5;
  short sVar6;
  int iVar7;
  uint uVar8;
  Goal *this_01;
  _func_int **pp_Var9;
  _Fact *f_ihlp;
  undefined4 extraout_var;
  uint64_t uVar10;
  HLPBindingMap *this_02;
  int64_t iVar11;
  long c;
  CSTOverlay *offspring;
  P<r_exec::Overlay> local_48;
  View *local_40;
  CSTOverlay *local_38;
  
  bVar5 = HLPController::is_orphan(&this->super_HLPController);
  if ((!bVar5) &&
     (iVar7 = (*((input->super_View).object.object)->_vptr__Object[0xe])(), (char)iVar7 == '\0')) {
    this_01 = _Fact::get_goal((_Fact *)(input->super_View).object.object);
    if ((this_01 == (Goal *)0x0) ||
       ((bVar5 = Goal::is_self_goal(this_01), !bVar5 || (bVar5 = Goal::is_drive(this_01), bVar5))))
    {
      __mutex = &(this->super_HLPController).super_OController.super_Controller.m_reductionMutex;
      iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar7 != 0) {
        std::__throw_system_error(iVar7);
      }
      pp_Var9 = (_func_int **)(*Now)();
      c = (this->super_HLPController).super_OController.overlays.used_cells_head;
      if (c == -1) {
        uVar8 = 0;
      }
      else {
        this_00 = &(this->super_HLPController).super_OController.overlays;
        uVar8 = 0;
        local_40 = input;
        do {
          p_Var2 = (this_00->cells).
                   super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                   ._M_impl.super__Vector_impl_data._M_start[c].data.object;
          pp_Var3 = p_Var2[0xb]._vptr__Object;
          if ((pp_Var3 == (_func_int **)0x0) || (pp_Var9 <= pp_Var3)) {
            iVar7 = (*p_Var2->_vptr__Object[4])();
            pcVar4 = (this_00->cells).
                     super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((char)iVar7 != '\0') {
              iVar11 = pcVar4[c].next;
              goto LAB_001622f4;
            }
            bVar5 = CSTOverlay::reduce((CSTOverlay *)pcVar4[c].data.object,local_40,&local_38);
            uVar8 = (uint)bVar5;
            if (local_38 == (CSTOverlay *)0x0) {
              iVar11 = (this_00->cells).
                       super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                       ._M_impl.super__Vector_impl_data._M_start[c].next;
              if (bVar5) goto LAB_001622f4;
            }
            else {
              local_48.object = (_Object *)local_38;
              LOCK();
              paVar1 = &(local_38->super_HLPOverlay).super_Overlay.super__Object.refCount;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + 1;
              UNLOCK();
              r_code::list<core::P<r_exec::Overlay>_>::push_front(this_00,&local_48);
              iVar11 = c;
              if ((CSTOverlay *)local_48.object != (CSTOverlay *)0x0) {
                LOCK();
                ((local_48.object)->refCount).super___atomic_base<long>._M_i =
                     ((local_48.object)->refCount).super___atomic_base<long>._M_i + -1;
                UNLOCK();
                if (((local_48.object)->refCount).super___atomic_base<long>._M_i < 1) {
                  (*(((HLPOverlay *)&(local_48.object)->_vptr__Object)->super_Overlay).super__Object
                    ._vptr__Object[1])();
                }
              }
            }
          }
          else {
            iVar11 = (this_00->cells).
                     super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                     ._M_impl.super__Vector_impl_data._M_start[c].next;
LAB_001622f4:
            r_code::list<core::P<r_exec::Overlay>_>::__erase(this_00,c);
          }
          c = iVar11;
        } while (iVar11 != -1);
      }
      (*(this->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object
        [8])(this,(ulong)uVar8);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    else {
      f_ihlp = Goal::get_target(this_01);
      (*(f_ihlp->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[4])(f_ihlp,0);
      sVar6 = r_code::Atom::asOpcode();
      if ((sVar6 == Opcodes::ICst) &&
         ((iVar7 = (*(f_ihlp->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                     super_LObject.super_Code.super__Object._vptr__Object[9])(f_ihlp,0),
          (_Object *)CONCAT44(extraout_var,iVar7) ==
          (((this->super_HLPController).super_OController.super_Controller.view)->object).object &&
          (uVar10 = HLPController::get_requirement_count(&this->super_HLPController), uVar10 == 0)))
         ) {
        this_02 = (HLPBindingMap *)operator_new(0x40);
        HLPBindingMap::HLPBindingMap(this_02);
        LOCK();
        paVar1 = &(this_02->super_BindingMap).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
        HLPBindingMap::init_from_f_ihlp(this_02,f_ihlp);
        bVar5 = HLPController::evaluate_bwd_guards(&this->super_HLPController,this_02);
        if (bVar5) {
          abduce(this,this_02,(Fact *)(input->super_View).object.object);
        }
        LOCK();
        paVar1 = &(this_02->super_BindingMap).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((this_02->super_BindingMap).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(this_02->super_BindingMap).super__Object._vptr__Object[1])(this_02);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void CSTController::reduce(r_exec::View *input)
{
    if (is_orphan()) {
        return;
    }

    if (input->object->is_invalidated()) {
        return;
    }

    Goal *goal = ((_Fact *)input->object)->get_goal();

    if (goal && goal->is_self_goal() && !goal->is_drive()) { // goal is g->f->target.
        _Fact *goal_target = goal->get_target(); // handle only icst.

        if (goal_target->code(0).asOpcode() == Opcodes::ICst && goal_target->get_reference(0) == getObject()) { // f is f->icst; produce as many sub-goals as there are patterns in the cst.
            if (!get_requirement_count()) { // models will attempt to produce the icst
                P<HLPBindingMap> bm = new HLPBindingMap;
                bm->init_from_f_ihlp(goal_target);

                if (evaluate_bwd_guards(bm)) { // leaves the controller constant: no need to protect; bm may be updated.
                    abduce(bm, input->object);
                }
            }
        }
    } else {
        // std::cout<<"CTRL: "<<get_host()->get_oid()<<" > "<<input->object->get_oid()<<std::endl;
        bool match = false;
        CSTOverlay *offspring;
        r_code::list<P<Overlay> >::const_iterator o;
        std::lock_guard<std::mutex> guard(m_reductionMutex);
        uint64_t now = Now();

        for (o = overlays.begin(); o != overlays.end();) {
            if (!((CSTOverlay *)*o)->can_match(now)) {
                o = overlays.erase(o);
            } else if ((*o)->is_invalidated()) {
                o = overlays.erase(o);
            } else {
                match = ((CSTOverlay *)*o)->reduce(input, offspring);

                if (offspring) {
                    overlays.push_front(offspring);
                } else if (match) { // full match: no offspring.
                    o = overlays.erase(o);
                } else {
                    ++o;
                }
            }
        }

        check_last_match_time(match);
    }
}